

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *stream,QCborValue *value)

{
  Code CVar1;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  QByteArray buffer;
  QCborParserError parseError;
  QCborValue *in_stack_ffffffffffffff70;
  QCborValue *in_stack_ffffffffffffff78;
  QByteArray *ba;
  QDataStream *in_stack_ffffffffffffff98;
  QByteArray *ba_00;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ba_00 = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  ba = (QByteArray *)&stack0xffffffffffffffb8;
  QByteArray::QByteArray((QByteArray *)0x475b90);
  operator>>(in_stack_ffffffffffffff98,ba);
  uStack_10 = 0xaaaaaaaa00000000;
  QCborValue::fromCbor(ba_00,(QCborParserError *)in_RDI);
  QCborValue::operator=(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  QCborValue::~QCborValue(in_stack_ffffffffffffff70);
  CVar1 = QCborError::operator_cast_to_Code((QCborError *)&uStack_10);
  if (CVar1 != NoError) {
    QDataStream::setStatus(in_RDI,ReadCorruptData);
  }
  QByteArray::~QByteArray((QByteArray *)0x475c5f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QCborValue &value)
{
    QByteArray buffer;
    stream >> buffer;
    QCborParserError parseError{};
    value = QCborValue::fromCbor(buffer, &parseError);
    if (parseError.error)
        stream.setStatus(QDataStream::ReadCorruptData);
    return stream;
}